

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectDrawSurface.cpp
# Opt level: O1

Stream * nv::operator<<(Stream *s,DDSHeader *header)

{
  Stream::byteOrderSerialize(s,header,4);
  Stream::byteOrderSerialize(s,&header->size,4);
  Stream::byteOrderSerialize(s,&header->flags,4);
  Stream::byteOrderSerialize(s,&header->height,4);
  Stream::byteOrderSerialize(s,&header->width,4);
  Stream::byteOrderSerialize(s,&header->pitch,4);
  Stream::byteOrderSerialize(s,&header->depth,4);
  Stream::byteOrderSerialize(s,&header->mipmapcount,4);
  (*s->_vptr_Stream[2])(s,header->reserved,0x2c);
  Stream::byteOrderSerialize(s,&header->pf,4);
  Stream::byteOrderSerialize(s,&(header->pf).flags,4);
  Stream::byteOrderSerialize(s,&(header->pf).fourcc,4);
  Stream::byteOrderSerialize(s,&(header->pf).bitcount,4);
  Stream::byteOrderSerialize(s,&(header->pf).rmask,4);
  Stream::byteOrderSerialize(s,&(header->pf).gmask,4);
  Stream::byteOrderSerialize(s,&(header->pf).bmask,4);
  Stream::byteOrderSerialize(s,&(header->pf).amask,4);
  Stream::byteOrderSerialize(s,&header->caps,4);
  Stream::byteOrderSerialize(s,&(header->caps).caps2,4);
  Stream::byteOrderSerialize(s,&(header->caps).caps3,4);
  Stream::byteOrderSerialize(s,&(header->caps).caps4,4);
  Stream::byteOrderSerialize(s,&header->notused,4);
  if ((header->pf).fourcc == 0x30315844) {
    Stream::byteOrderSerialize(s,&header->header10,4);
    Stream::byteOrderSerialize(s,&(header->header10).resourceDimension,4);
    Stream::byteOrderSerialize(s,&(header->header10).miscFlag,4);
    Stream::byteOrderSerialize(s,&(header->header10).arraySize,4);
    Stream::byteOrderSerialize(s,&(header->header10).reserved,4);
  }
  return s;
}

Assistant:

Stream & operator<< (Stream & s, DDSHeader & header)
	{
		nvStaticCheck(sizeof(DDSHeader) == 148);
		s << header.fourcc;
		s << header.size;
		s << header.flags;
		s << header.height;
		s << header.width;
		s << header.pitch;
		s << header.depth;
		s << header.mipmapcount;
		s.serialize(header.reserved, 11 * sizeof(uint));
		s << header.pf;
		s << header.caps;
		s << header.notused;
		
		if (header.hasDX10Header())
		{
			s << header.header10;
		}
		
		return s;
	}